

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

void __thiscall
soul::CompileMessageList::addWarning(CompileMessageList *this,string *desc,CodeLocation *location)

{
  CompileMessage local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)desc);
  local_50.location.sourceCode.object = (location->sourceCode).object;
  if (local_50.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_50.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_50.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_50.location.location.data = (location->location).data;
  local_50.type = warning;
  local_50.category = none;
  add(this,&local_50);
  CompileMessage::~CompileMessage(&local_50);
  return;
}

Assistant:

void CompileMessageList::addWarning (const std::string& desc, CodeLocation location)
{
    add ({ desc, location, CompileMessage::Type::warning });
}